

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSet::spanUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint8_t *s0;
  uint uVar8;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  UnicodeSetStringSpan strSpan;
  UnicodeSetStringSpan UStack_148;
  ulong uVar9;
  
  iVar2 = (int32_t)&UStack_148;
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    if (length < 0) {
      sVar4 = strlen(s);
      length = (int32_t)sVar4;
    }
    if (length == 0) {
      iVar11 = 0;
    }
    else {
      if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
        iVar2 = UnicodeSetStringSpan::spanUTF8(this->stringSpan,(uint8_t *)s,length,spanCondition);
        return iVar2;
      }
      if (this->strings->count != 0) {
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  (&UStack_148,this,this->strings,0x26 - (spanCondition == USET_SPAN_NOT_CONTAINED))
        ;
        if (UStack_148.maxLength8 != 0) {
          iVar2 = UnicodeSetStringSpan::spanUTF8(&UStack_148,(uint8_t *)s,length,spanCondition);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan(&UStack_148);
        if (UStack_148.maxLength8 != 0) {
          return iVar2;
        }
      }
      uVar12 = 0;
      do {
        lVar5 = (long)(int)uVar12;
        uVar9 = lVar5 + 1;
        bVar7 = s[lVar5];
        uVar10 = (uint)bVar7;
        if ((char)bVar7 < '\0') {
          if ((uint)uVar9 != length) {
            if (bVar7 < 0xe0) {
              if (0xc1 < bVar7) {
                uVar10 = bVar7 & 0x1f;
LAB_001a34aa:
                if ((byte)((byte)s[(int)uVar9] ^ 0x80) < 0x40) {
                  uVar10 = uVar10 << 6 | (byte)s[(int)uVar9] ^ 0x80;
                  uVar9 = (ulong)((int)uVar9 + 1);
                  goto LAB_001a3442;
                }
              }
            }
            else if (bVar7 < 0xf0) {
              uVar10 = bVar7 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar10] >> ((byte)s[uVar9] >> 5) & 1) != 0) {
                bVar7 = s[uVar9] & 0x3f;
LAB_001a348e:
                uVar8 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar8;
                if (uVar8 != length) {
                  uVar10 = (uint)bVar7 | uVar10 << 6;
                  goto LAB_001a34aa;
                }
              }
            }
            else if (bVar7 < 0xf5) {
              if (((uint)(int)""[(byte)s[uVar9] >> 4] >> (uVar10 - 0xf0 & 0x1f) & 1) != 0) {
                uVar6 = lVar5 + 2;
                if (((uint)uVar6 == length) || (bVar7 = s[uVar6] + 0x80, 0x3f < bVar7)) {
                  uVar10 = 0xfffd;
                  uVar9 = uVar6 & 0xffffffff;
                  goto LAB_001a3442;
                }
                uVar10 = (byte)s[uVar9] & 0x3f | (uVar10 - 0xf0) * 0x40;
                uVar9 = uVar6 & 0xffffffff;
                goto LAB_001a348e;
              }
            }
          }
          uVar10 = 0xfffd;
        }
LAB_001a3442:
        UVar1 = contains(this,uVar10);
        if ((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) != (int)UVar1) {
          return (int)uVar12;
        }
        iVar11 = (int)uVar9;
        uVar12 = uVar9 & 0xffffffff;
      } while (iVar11 < length);
    }
  }
  else {
    puVar3 = BMPSet::spanUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    iVar11 = (int)puVar3 - (int)s;
  }
  return iVar11;
}

Assistant:

int32_t UnicodeSet::spanUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return (int32_t)(bmpSet->spanUTF8(s0, length, spanCondition)-s0);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::FWD_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::FWD_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t start=0, prev=0;
    do {
        U8_NEXT_OR_FFFD(s, start, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=start)<length);
    return prev;
}